

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  ImGuiWindow *this;
  undefined1 auVar1 [16];
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [64];
  undefined8 in_XMM1_Qb;
  ImRect IVar7;
  ImRect local_20;
  undefined1 auVar6 [56];
  
  pIVar2 = GImGui;
  auVar6 = in_ZMM0._8_56_;
  if (GImGui->ActiveId != 0) {
    return;
  }
  if (GImGui->HoveredId == 0) {
    pIVar4 = GImGui->NavWindow;
    if ((pIVar4 != (ImGuiWindow *)0x0) && (pIVar4->Appearing != false)) {
      return;
    }
    if ((GImGui->IO).MouseClicked[0] == true) {
      this = GImGui->HoveredRootWindow;
      if (this == (ImGuiWindow *)0x0) {
        if ((pIVar4 != (ImGuiWindow *)0x0) &&
           (pIVar4 = GetTopMostPopupModal(), pIVar4 == (ImGuiWindow *)0x0)) {
          FocusWindow((ImGuiWindow *)0x0);
        }
      }
      else if (((this->Flags & 0x4000000) == 0) || (bVar3 = IsPopupOpen(this->PopupId,0x100), bVar3)
              ) {
        StartMouseMovingWindow(pIVar2->HoveredWindow);
        if (((pIVar2->IO).ConfigWindowsMoveFromTitleBarOnly == true) && ((this->Flags & 1) == 0)) {
          IVar7 = ImGuiWindow::TitleBarRect(this);
          auVar5._0_8_ = IVar7.Min;
          auVar5._8_56_ = auVar6;
          auVar1._8_8_ = in_XMM1_Qb;
          auVar1._0_4_ = IVar7.Max.x;
          auVar1._4_4_ = IVar7.Max.y;
          local_20 = (ImRect)vmovlhps_avx(auVar5._0_16_,auVar1);
          bVar3 = ImRect::Contains(&local_20,(pIVar2->IO).MouseClickedPos);
          if (!bVar3) {
            pIVar2->MovingWindow = (ImGuiWindow *)0x0;
          }
        }
        if (pIVar2->HoveredIdDisabled == true) {
          pIVar2->MovingWindow = (ImGuiWindow *)0x0;
        }
      }
    }
    if ((pIVar2->IO).MouseClicked[1] == true) {
      pIVar4 = GetTopMostPopupModal();
      if ((pIVar2->HoveredWindow != (ImGuiWindow *)0x0) &&
         (bVar3 = IsWindowAbove(pIVar2->HoveredWindow,pIVar4), bVar3)) {
        pIVar4 = pIVar2->HoveredWindow;
      }
      ClosePopupsOverWindow(pIVar4,true);
    }
    return;
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click on empty space to focus window and start moving
    // (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        // Handle the edge case of a popup being closed while clicking in its empty space.
        // If we try to focus it, FocusWindow() > ClosePopupsOverWindow() will accidentally close any parent popups because they are not linked together any more.
        ImGuiWindow* root_window = g.HoveredRootWindow;
        const bool is_closed_popup = root_window && (root_window->Flags & ImGuiWindowFlags_Popup) && !IsPopupOpen(root_window->PopupId, ImGuiPopupFlags_AnyPopupLevel);

        if (root_window != NULL && !is_closed_popup)
        {
            StartMouseMovingWindow(g.HoveredWindow); //-V595

            // Cancel moving if clicked outside of title bar
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(root_window->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!root_window->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;

            // Cancel moving if clicked over an item which was disabled or inhibited by popups (note that we know HoveredId == 0 already)
            if (g.HoveredIdDisabled)
                g.MovingWindow = NULL;
        }
        else if (root_window == NULL && g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = g.HoveredWindow && IsWindowAbove(g.HoveredWindow, modal);
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}